

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_instance.c
# Opt level: O0

_Bool al_set_sample_instance_position(ALLEGRO_SAMPLE_INSTANCE *spl,uint val)

{
  _Bool _Var1;
  undefined4 in_ESI;
  long in_RDI;
  ALLEGRO_VOICE *voice;
  ALLEGRO_VOICE *in_stack_ffffffffffffffd8;
  
  if ((*(long *)(in_RDI + 0xf8) == 0) || ((*(byte *)(in_RDI + 0x100) & 1) == 0)) {
    maybe_lock_mutex((ALLEGRO_MUTEX *)0x1088c7);
    *(undefined4 *)(in_RDI + 0xbc) = in_ESI;
    maybe_unlock_mutex((ALLEGRO_MUTEX *)0x1088e7);
  }
  else {
    _Var1 = al_set_voice_position(in_stack_ffffffffffffffd8,0);
    if (!_Var1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool al_set_sample_instance_position(ALLEGRO_SAMPLE_INSTANCE *spl,
   unsigned int val)
{
   ASSERT(spl);

   if (spl->parent.u.ptr && spl->parent.is_voice) {
      ALLEGRO_VOICE *voice = spl->parent.u.voice;
      if (!al_set_voice_position(voice, val))
         return false;
   }
   else {
      maybe_lock_mutex(spl->mutex);
      spl->pos = val;
      maybe_unlock_mutex(spl->mutex);
   }

   return true;
}